

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_add2hash(FIOBJ dest,char *name,size_t name_len,char *value,size_t value_len,uint8_t encoded
                 )

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  FIOBJ val;
  double num;
  char *end;
  char *local_38;
  
  if (value_len == 5) {
    iVar3 = strncasecmp(value,anon_var_dwarf_21a,5);
    if (iVar3 == 0) {
      val = 0x26;
      goto LAB_0014a93d;
    }
LAB_0014a87a:
    local_38 = value;
    val = fio_atol(&local_38);
    pcVar2 = local_38;
    pcVar1 = value + value_len;
    if (local_38 == pcVar1) {
      if ((long)(val + 0x4000000000000000) < 0) {
        val = fiobj_num_new_bignum(val);
      }
      else {
        val = (val * 2 | val & 0x8000000000000000) + 1;
      }
    }
    if (pcVar2 == pcVar1) goto LAB_0014a93d;
    local_38 = value;
    num = fio_atof(&local_38);
    if (local_38 == pcVar1) {
      val = fiobj_float_new(num);
      goto LAB_0014a93d;
    }
    if (encoded != '\0') {
      val = http_urlstr2fiobj(value,value_len);
      goto LAB_0014a93d;
    }
  }
  else {
    if (value_len == 4) {
      iVar3 = strncasecmp(value,anon_var_dwarf_225,4);
      if (iVar3 == 0) {
        val = 0x16;
        goto LAB_0014a93d;
      }
      iVar3 = strncasecmp(value,anon_var_dwarf_20f,4);
      if (iVar3 == 0) {
        val = 6;
        goto LAB_0014a93d;
      }
      goto LAB_0014a87a;
    }
    if (value_len != 0) goto LAB_0014a87a;
    value = (char *)0x0;
    value_len = 0;
  }
  val = fiobj_str_new(value,value_len);
LAB_0014a93d:
  iVar3 = http_add2hash2(dest,name,name_len,val,encoded);
  return iVar3;
}

Assistant:

int http_add2hash(FIOBJ dest, char *name, size_t name_len, char *value,
                  size_t value_len, uint8_t encoded) {
  return http_add2hash2(dest, name, name_len,
                        http_str2fiobj(value, value_len, encoded), encoded);
}